

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O0

double __thiscall
TankMixModel::findLIFOQuality(TankMixModel *this,double vNet,double vIn,double wIn,SegPool *segPool)

{
  Segment *pSVar1;
  SystemError *this_00;
  double *pdVar2;
  double extraout_XMM0_Qa;
  double local_70;
  double vSeg;
  Segment *seg_1;
  double wSum;
  double vSum;
  Segment *seg;
  double cIn;
  SegPool *segPool_local;
  double wIn_local;
  double vIn_local;
  double vNet_local;
  TankMixModel *this_local;
  
  vNet_local = (double)this;
  if (vNet <= 0.0) {
    if (vNet < 0.0) {
      wSum = 0.0;
      seg_1 = (Segment *)0x0;
      vIn_local = -vNet;
      while ((0.0 < vIn_local && (pSVar1 = this->firstSeg, pSVar1 != (Segment *)0x0))) {
        pdVar2 = std::min<double>(&pSVar1->v,&vIn_local);
        local_70 = *pdVar2;
        if (pSVar1->next == (Segment *)0x0) {
          local_70 = vIn_local;
        }
        wSum = local_70 + wSum;
        seg_1 = (Segment *)(pSVar1->c * local_70 + (double)seg_1);
        vIn_local = vIn_local - local_70;
        if (((vIn_local < 0.0) || (local_70 < pSVar1->v)) || (pSVar1->next == (Segment *)0x0)) {
          pSVar1->v = pSVar1->v - local_70;
        }
        else {
          this->firstSeg = pSVar1->next;
          SegPool::freeSegment(segPool,pSVar1);
        }
      }
      this->cTank = ((double)seg_1 + wIn) / (wSum + vIn);
    }
  }
  else {
    vIn_local = vNet;
    if ((this->firstSeg == (Segment *)0x0) || (std::abs((int)this), this->cTol <= extraout_XMM0_Qa))
    {
      pSVar1 = SegPool::getSegment(segPool,vIn_local,wIn / vIn);
      if (pSVar1 == (Segment *)0x0) {
        this_00 = (SystemError *)__cxa_allocate_exception(0x30);
        SystemError::SystemError(this_00,0);
        __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
      }
      pSVar1->next = this->firstSeg;
      this->firstSeg = pSVar1;
    }
    else {
      this->firstSeg->v = vIn_local + this->firstSeg->v;
    }
    this->cTank = this->firstSeg->c;
  }
  return this->cTank;
}

Assistant:

double TankMixModel::findLIFOQuality(double vNet, double vIn, double wIn,
                                     SegPool* segPool)
{
    // ... if filling then create a new first segment
    if ( vNet > 0.0 )
    {
        // ... increase current first segment volume if inflow has same quality
        double cIn = wIn / vIn;
        if ( firstSeg && abs(firstSeg->c - cIn ) < cTol ) firstSeg->v += vNet;

        // ... otherwise add a new first segment to the tank
        else
        {
            Segment* seg = segPool->getSegment(vNet, cIn);
            if ( seg == nullptr ) throw SystemError(SystemError::OUT_OF_MEMORY);
            seg->next = firstSeg;
            firstSeg = seg;
        }
        cTank = firstSeg->c;
    }

    // ... if emptying then remove first segments until vNet is reached
    else if ( vNet < 0.0 )
    {
        double vSum = 0.0;
        double wSum = 0.0;
        vNet = -vNet;
        while ( vNet > 0.0 )
        {
            Segment* seg = firstSeg;
            if ( seg == nullptr ) break;
            double vSeg = min(seg->v, vNet);
            if ( seg->next == nullptr ) vSeg = vNet;
            vSum += vSeg;
            wSum += seg->c * vSeg;
            vNet -= vSeg;
            if ( vNet >= 0.0 && vSeg >= seg->v && seg->next )
            {
                firstSeg = seg->next;
                segPool->freeSegment(seg);
            }
            else seg->v -= vSeg;
        }

        // ... avg. quality released is mixture of quality in flow
        //     released and any inflow
        cTank = (wSum + wIn) / (vSum + vIn);
    }
    return cTank;
 }